

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O0

void __thiscall xemmai::io::t_file::f_close(t_file *this)

{
  t_file *this_local;
  
  t_sharable::
  f_owned_or_shared<xemmai::t_lock_with_safe_region,xemmai::io::t_file::f_close()::_lambda()_1_>
            (&this->super_t_sharable,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void f_close()
	{
		f_owned_or_shared<t_lock_with_safe_region>([&]
		{
			if (v_fd < 0) f_throw(L"already closed."sv);
			if (!v_own) f_throw(L"can not close unown."sv);
			while (close(v_fd) == -1) if (errno != EINTR) portable::f_throw_system_error();
			v_fd = -1;
		});
	}